

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

ExpressionValue *
expLabelFuncHeaderSize
          (ExpressionValue *__return_storage_ptr__,Identifier *funcName,
          vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer psVar2;
  element_type *args_1;
  long lVar3;
  
  psVar2 = (parameters->
           super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((parameters->
      super__Vector_base<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>)._M_impl.
      super__Vector_impl_data._M_finish == psVar2) {
    paVar1 = &(__return_storage_ptr__->strValue)._value.field_2;
    if ((g_fileManager->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      lVar3 = FileManager::getHeaderSize(g_fileManager);
      (__return_storage_ptr__->strValue)._value._M_dataplus._M_p = (pointer)paVar1;
LAB_0012b679:
      (__return_storage_ptr__->strValue)._value._M_string_length = 0;
      (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->type = Integer;
      (__return_storage_ptr__->field_1).intValue = lVar3;
      return __return_storage_ptr__;
    }
    Logger::queueError<>(Error,"headersize: no file opened");
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    args_1 = (psVar2->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (args_1 != (element_type *)0x0) {
      if (args_1->physicalValueSet != false) {
        lVar3 = args_1->value - args_1->physicalValue;
        (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
        goto LAB_0012b679;
      }
      Logger::queueError<Identifier,Identifier>
                (Error,"%s: parameter %s has no physical address",funcName,&args_1->name);
    }
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  }
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expLabelFuncHeaderSize(const Identifier &funcName, const std::vector<std::shared_ptr<Label>>& parameters)
{
	// return difference between physical and virtual address of label parameter
	if (parameters.size())
	{
		Label* label = parameters.front().get();
		if (!label)
			return ExpressionValue();

		if (!label->hasPhysicalValue())
		{
			Logger::queueError(Logger::Error, "%s: parameter %s has no physical address", funcName, label->getName());
			return ExpressionValue();
		}

		return ExpressionValue(label->getValue() - label->getPhysicalValue());
	}

	if(!g_fileManager->hasOpenFile())
	{
		Logger::queueError(Logger::Error, "headersize: no file opened");
		return ExpressionValue();
	}
	return ExpressionValue(g_fileManager->getHeaderSize());
}